

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_string_normalize_D(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  char cVar1;
  wchar_t wVar2;
  bool bVar3;
  bool bVar4;
  archive_string *paVar5;
  long lVar6;
  archive_string *paVar7;
  size_t sVar8;
  uint uVar9;
  undefined7 uVar11;
  long lVar10;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  uint uVar20;
  undefined8 unaff_R14;
  undefined7 uVar22;
  char *pcVar21;
  ulong uVar23;
  ulong uVar24;
  uint32_t uc;
  uint32_t uc2;
  anon_struct_8_2_74731b7c fdc [10];
  uint local_fc;
  size_t local_f8;
  code *local_f0;
  long local_e8;
  archive_string *local_e0;
  undefined4 local_d4;
  long local_d0;
  long local_c8;
  char *local_c0;
  wchar_t local_b8;
  uint local_b4;
  ulong local_b0;
  code *local_a8;
  int local_9c;
  uint local_98;
  uint32_t local_94;
  ulong local_90;
  undefined8 local_88;
  
  wVar2 = sc->flag;
  uVar11 = (undefined7)((ulong)sc >> 8);
  uVar22 = (undefined7)((ulong)unaff_R14 >> 8);
  if (((uint)wVar2 >> 10 & 1) == 0) {
    if (((uint)wVar2 >> 0xc & 1) == 0) {
      if (((uint)wVar2 >> 8 & 1) == 0) {
        if (((uint)wVar2 >> 0xb & 1) == 0) {
          uVar20 = (uint)wVar2 >> 0xd & 1;
          uVar12 = (ulong)uVar20;
          lVar6 = uVar12 + 1;
          local_f0 = unicode_to_utf8;
          if (uVar20 != 0) {
            local_f0 = unicode_to_utf16le;
          }
        }
        else {
          local_f0 = unicode_to_utf16be;
          lVar6 = 2;
          uVar12 = CONCAT71(uVar22,1);
        }
        local_d4 = 0;
      }
      else {
        local_d4 = (undefined4)CONCAT71(uVar11,((uint)wVar2 >> 9 & 1) == 0);
        local_f0 = unicode_to_utf8;
        lVar6 = 1;
        uVar12 = 0;
      }
      goto LAB_001590c4;
    }
    local_d4 = (undefined4)CONCAT71(uVar11,((uint)wVar2 >> 0xd & 1) == 0);
    local_f0 = unicode_to_utf16le;
  }
  else {
    local_d4 = (undefined4)CONCAT71(uVar11,((uint)wVar2 >> 0xb & 1) == 0);
    local_f0 = unicode_to_utf16be;
  }
  lVar6 = 2;
  uVar12 = CONCAT71(uVar22,1);
LAB_001590c4:
  local_e8 = 1;
  local_9c = 4;
  if (((uint)wVar2 >> 0xb & 1) == 0) {
    if (((uint)wVar2 >> 0xd & 1) == 0) {
      local_a8 = cesu8_to_unicode;
      local_9c = 6;
      local_e8 = lVar6;
    }
    else {
      local_a8 = utf16le_to_unicode;
    }
  }
  else {
    local_a8 = utf16be_to_unicode;
  }
  local_e0 = as;
  local_c0 = (char *)_p;
  paVar5 = archive_string_ensure(as,local_e8 * len + lVar6 + as->length);
  if (paVar5 == (archive_string *)0x0) {
    return L'\xffffffff';
  }
  pcVar18 = as->s + as->length;
  local_c8 = -lVar6;
  pcVar19 = as->s + (as->buffer_length - lVar6);
  local_b8 = L'\0';
  local_d0 = lVar6;
  local_90 = uVar12;
LAB_0015916e:
  uVar20 = (*local_a8)(&local_fc,local_c0,len);
  if (uVar20 != 0) {
    uVar12 = (ulong)uVar20;
    if (-1 < (int)uVar20) {
LAB_0015918f:
      paVar5 = local_e0;
      pcVar21 = local_c0;
      if ((int)uVar12 == local_9c) {
        pcVar21 = (char *)0x0;
      }
      if ((char)local_d4 != '\0') {
        pcVar21 = (char *)0x0;
      }
      local_c0 = local_c0 + uVar12;
      len = len - uVar12;
      uVar20 = local_fc - 0xac00;
      local_f8 = len;
      if (uVar20 < 0x2ba4) {
        local_fc = uVar20 / 0x24c | 0x1100;
        lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18);
        paVar5 = local_e0;
        if (lVar6 != 0) goto LAB_00159763;
        sVar8 = (long)pcVar18 - (long)local_e0->s;
        lVar10 = local_f8 * local_e8 + local_d0;
        goto LAB_00159820;
      }
      local_b0 = uVar12;
      if ((((0x1d2ff < local_fc) || (0x1d244 < local_fc)) || (""[local_fc >> 8] == '\0')) ||
         (ccc_val[ccc_val_index[""[local_fc >> 8]][local_fc >> 4 & 0xf]][local_fc & 0xf] == '\0')) {
        lVar6 = 1;
        uVar23 = 0;
        do {
          bVar3 = false;
          if (((0x2ff < local_fc - 0x2f800) && ((local_fc & 0xfffff000) != 0x2000)) &&
             (0x1ff < local_fc - 0xf900)) {
            iVar13 = 0;
            if ((local_fc - 0x1109a < 0x12) && ((0x20005U >> (local_fc - 0x1109a & 0x1f) & 1) != 0))
            {
              bVar3 = false;
            }
            else {
              iVar16 = 0x3a2;
              do {
                bVar3 = iVar13 <= iVar16;
                if (iVar16 < iVar13) break;
                iVar15 = (iVar16 + iVar13) / 2;
                if (u_decomposition_table[iVar15].nfc < local_fc) {
                  iVar13 = iVar15 + 1;
                  bVar4 = true;
                }
                else if (local_fc < u_decomposition_table[iVar15].nfc) {
                  iVar16 = iVar15 + -1;
                  bVar4 = true;
                }
                else {
                  local_94 = u_decomposition_table[iVar15].cp1;
                  local_98 = u_decomposition_table[iVar15].cp2;
                  bVar4 = false;
                }
              } while (bVar4);
            }
          }
          if ((!bVar3) || (9 < (uint)uVar23)) goto LAB_001593ac;
          lVar10 = lVar6;
          if ((uint)uVar23 != 0) {
            do {
              (&local_90)[lVar10] = (&local_88)[(int)lVar10 - 2];
              lVar10 = lVar10 + -1;
            } while (1 < lVar10);
          }
          local_88._4_4_ = 0;
          if (local_98 < 0x1d245) {
            local_88._4_4_ =
                 (uint)ccc_val[ccc_val_index[""[local_98 >> 8]][local_98 >> 4 & 0xf]]
                       [local_98 & 0xf];
          }
          local_88._0_4_ = local_98;
          uVar23 = uVar23 + 1;
          local_fc = local_94;
          lVar6 = lVar6 + 1;
          pcVar21 = (char *)0x0;
        } while( true );
      }
      if (pcVar21 == (char *)0x0) {
        lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
        paVar5 = local_e0;
        len = local_f8;
        if (lVar6 != 0) goto LAB_00159a5d;
        lVar10 = local_f8 * local_e8 + local_d0;
        local_e0->length = (long)pcVar18 - (long)local_e0->s;
        paVar7 = archive_string_ensure(local_e0,local_e0->buffer_length + lVar10);
        iVar13 = 1;
        goto LAB_00159a9b;
      }
      if (pcVar19 < pcVar18 + uVar12) {
        local_e0->length = (long)pcVar18 - (long)local_e0->s;
        paVar7 = archive_string_ensure(local_e0,len * local_e8 + local_d0 + local_e0->buffer_length)
        ;
        if (paVar7 == (archive_string *)0x0) goto LAB_00159872;
        pcVar18 = paVar5->s + paVar5->length;
        pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
      }
      iVar13 = 2;
      switch((int)local_b0) {
      case 4:
        cVar1 = *pcVar21;
        pcVar21 = pcVar21 + 1;
        *pcVar18 = cVar1;
        pcVar18 = pcVar18 + 1;
      case 3:
        cVar1 = *pcVar21;
        pcVar21 = pcVar21 + 1;
        *pcVar18 = cVar1;
        pcVar18 = pcVar18 + 1;
      case 2:
        cVar1 = *pcVar21;
        pcVar21 = pcVar21 + 1;
        *pcVar18 = cVar1;
        pcVar18 = pcVar18 + 1;
      case 1:
        *pcVar18 = *pcVar21;
        pcVar18 = pcVar18 + 1;
      }
      goto switchD_0015999b_default;
    }
LAB_00159695:
    lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
    paVar5 = local_e0;
    if (lVar6 == 0) {
      sVar8 = (long)pcVar18 - (long)local_e0->s;
      lVar10 = len * local_e8 + local_d0;
      while( true ) {
        paVar5->length = sVar8;
        paVar7 = archive_string_ensure(paVar5,paVar5->buffer_length + lVar10);
        if (paVar7 == (archive_string *)0x0) break;
        pcVar18 = paVar5->s + paVar5->length;
        pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
        lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
        if (lVar6 != 0) goto LAB_001596ab;
        sVar8 = (long)pcVar18 - (long)paVar5->s;
      }
      goto LAB_00159872;
    }
LAB_001596ab:
    pcVar18 = pcVar18 + lVar6;
    local_c0 = local_c0 + -uVar20;
    iVar13 = 2;
    local_b8 = L'\xffffffff';
    len = len - -uVar20;
    goto switchD_0015999b_default;
  }
  goto LAB_00159aed;
LAB_00159820:
  paVar5->length = sVar8;
  paVar7 = archive_string_ensure(paVar5,paVar5->buffer_length + lVar10);
  len = local_f8;
  if (paVar7 == (archive_string *)0x0) goto LAB_00159872;
  pcVar18 = paVar5->s + paVar5->length;
  pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
  lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
  if (lVar6 != 0) goto LAB_00159763;
  sVar8 = (long)pcVar18 - (long)paVar5->s;
  goto LAB_00159820;
LAB_00159763:
  pcVar18 = pcVar18 + lVar6;
  local_fc = (uVar20 % 0x24c) / 0x1c + 0x1161;
  lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18);
  paVar5 = local_e0;
  if (lVar6 == 0) {
    lVar10 = local_f8 * local_e8 + local_d0;
    local_e0->length = (long)pcVar18 - (long)local_e0->s;
    paVar7 = archive_string_ensure(local_e0,local_e0->buffer_length + lVar10);
    iVar13 = 1;
    while (len = local_f8, paVar7 != (archive_string *)0x0) {
      pcVar18 = paVar5->s + paVar5->length;
      pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
      lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
      if (lVar6 != 0) goto LAB_0015979d;
      paVar5->length = (long)pcVar18 - (long)paVar5->s;
      paVar7 = archive_string_ensure(paVar5,paVar5->buffer_length + lVar10);
    }
  }
  else {
LAB_0015979d:
    pcVar18 = pcVar18 + lVar6;
    iVar13 = 2;
    len = local_f8;
    if (uVar20 % 0x1c != 0) {
      local_fc = uVar20 % 0x1c + 0x11a7;
      lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18);
      paVar5 = local_e0;
      len = local_f8;
      if (lVar6 == 0) {
        sVar8 = (long)pcVar18 - (long)local_e0->s;
        lVar10 = local_f8 * local_e8 + local_d0;
        while( true ) {
          paVar5->length = sVar8;
          paVar7 = archive_string_ensure(paVar5,paVar5->buffer_length + lVar10);
          if (paVar7 == (archive_string *)0x0) break;
          pcVar18 = paVar5->s + paVar5->length;
          pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
          lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
          if (lVar6 != 0) goto LAB_001597f6;
          sVar8 = (long)pcVar18 - (long)paVar5->s;
        }
LAB_00159872:
        iVar13 = 1;
      }
      else {
LAB_001597f6:
        pcVar18 = pcVar18 + lVar6;
      }
    }
  }
switchD_0015999b_default:
  if (iVar13 != 2) {
    if (iVar13 != 3) {
      return L'\xffffffff';
    }
LAB_00159aed:
    local_e0->length = (long)pcVar18 - (long)local_e0->s;
    *pcVar18 = '\0';
    if ((char)local_90 == '\0') {
      return local_b8;
    }
    local_e0->s[local_e0->length + 1] = '\0';
    return local_b8;
  }
  goto LAB_0015916e;
LAB_001593ac:
  uVar20 = (*local_a8)(&local_b4,local_c0,local_f8);
  paVar5 = local_e0;
  uVar12 = (ulong)uVar20;
  if ((int)uVar20 < 1) goto LAB_00159491;
  uVar9 = 0;
  if (local_b4 < 0x1d245) {
    uVar9 = (uint)ccc_val[ccc_val_index[""[local_b4 >> 8]][local_b4 >> 4 & 0xf]][local_b4 & 0xf];
  }
  if ((uVar9 == 0) || (9 < uVar23)) goto LAB_00159491;
  uVar24 = uVar23;
  if (uVar23 != 0) {
    uVar17 = 0;
    do {
      if ((int)uVar9 < *(int *)((long)&local_88 + (uVar17 * 2 + 1) * 4)) {
        uVar14 = uVar23;
        uVar24 = uVar17;
        if (uVar17 < uVar23) {
          do {
            (&local_88)[uVar14] = (&local_90)[uVar14];
            uVar14 = uVar14 - 1;
          } while ((long)uVar17 < (long)uVar14);
        }
        break;
      }
      uVar17 = uVar17 + 1;
    } while (uVar23 != uVar17);
  }
  local_c0 = local_c0 + uVar12;
  *(uint *)((long)&local_88 + (uVar24 * 2 + 1) * 4) = uVar9;
  *(uint *)(&local_88 + uVar24) = local_b4;
  uVar23 = uVar23 + 1;
  local_f8 = local_f8 - uVar12;
  goto LAB_001593ac;
LAB_00159491:
  if (pcVar21 == (char *)0x0) {
    lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
    paVar5 = local_e0;
    if (lVar6 == 0) {
      sVar8 = (long)pcVar18 - (long)local_e0->s;
      lVar10 = local_f8 * local_e8 + local_d0;
      while( true ) {
        paVar5->length = sVar8;
        paVar7 = archive_string_ensure(paVar5,paVar5->buffer_length + lVar10);
        len = local_f8;
        if (paVar7 == (archive_string *)0x0) goto LAB_00159872;
        pcVar18 = paVar5->s + paVar5->length;
        pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
        lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
        if (lVar6 != 0) break;
        sVar8 = (long)pcVar18 - (long)paVar5->s;
      }
    }
    pcVar18 = pcVar18 + lVar6;
  }
  else {
    if (pcVar19 < pcVar18 + local_b0) {
      local_e0->length = (long)pcVar18 - (long)local_e0->s;
      paVar7 = archive_string_ensure
                         (local_e0,local_f8 * local_e8 + local_d0 + local_e0->buffer_length);
      if (paVar7 == (archive_string *)0x0) {
        iVar13 = 1;
        len = local_f8;
        goto switchD_0015999b_default;
      }
      pcVar18 = paVar5->s + paVar5->length;
      pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
    }
    switch((int)local_b0) {
    case 4:
      cVar1 = *pcVar21;
      pcVar21 = pcVar21 + 1;
      *pcVar18 = cVar1;
      pcVar18 = pcVar18 + 1;
    case 3:
      cVar1 = *pcVar21;
      pcVar21 = pcVar21 + 1;
      *pcVar18 = cVar1;
      pcVar18 = pcVar18 + 1;
    case 2:
      cVar1 = *pcVar21;
      pcVar21 = pcVar21 + 1;
      *pcVar18 = cVar1;
      pcVar18 = pcVar18 + 1;
    case 1:
      *pcVar18 = *pcVar21;
      pcVar18 = pcVar18 + 1;
    }
  }
  if ((int)uVar23 != 0) {
    lVar6 = local_f8 * local_e8 + local_d0;
    uVar23 = uVar23 & 0xffffffff;
    uVar24 = 0;
    local_b0 = uVar23;
    do {
      local_fc = *(uint *)(&local_88 + uVar24);
      lVar10 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18);
      paVar5 = local_e0;
      while (lVar10 == 0) {
        paVar5->length = (long)pcVar18 - (long)paVar5->s;
        paVar7 = archive_string_ensure(paVar5,paVar5->buffer_length + lVar6);
        len = local_f8;
        if (paVar7 == (archive_string *)0x0) goto LAB_00159872;
        pcVar18 = paVar5->s + paVar5->length;
        pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
        lVar10 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
        uVar23 = local_b0;
      }
      pcVar18 = pcVar18 + lVar10;
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar23);
  }
  len = local_f8;
  if (uVar20 == 0) {
    iVar13 = 3;
    goto switchD_0015999b_default;
  }
  local_fc = local_b4;
  if ((int)uVar20 < 0) goto LAB_00159695;
  goto LAB_0015918f;
LAB_00159a9b:
  if (paVar7 == (archive_string *)0x0) goto switchD_0015999b_default;
  pcVar18 = paVar5->s + paVar5->length;
  pcVar19 = paVar5->s + local_c8 + paVar5->buffer_length;
  lVar6 = (*local_f0)(pcVar18,(long)pcVar19 - (long)pcVar18,local_fc);
  if (lVar6 != 0) goto LAB_00159a5d;
  paVar5->length = (long)pcVar18 - (long)paVar5->s;
  paVar7 = archive_string_ensure(paVar5,paVar5->buffer_length + lVar10);
  goto LAB_00159a9b;
LAB_00159a5d:
  pcVar18 = pcVar18 + lVar6;
  iVar13 = 2;
  goto switchD_0015999b_default;
}

Assistant:

static int
archive_string_normalize_D(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr;
		uint32_t cp1, cp2;
		int SIndex;
		struct {
			uint32_t uc;
			int ccc;
		} fdc[FDC_MAX];
		int fdi, fdj;
		int ccc;

check_first_code:
		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Hangul Decomposition. */
		if ((SIndex = uc - HC_SBASE) >= 0 && SIndex < HC_SCOUNT) {
			int L = HC_LBASE + SIndex / HC_NCOUNT;
			int V = HC_VBASE + (SIndex % HC_NCOUNT) / HC_TCOUNT;
			int T = HC_TBASE + SIndex % HC_TCOUNT;

			REPLACE_UC_WITH(L);
			WRITE_UC();
			REPLACE_UC_WITH(V);
			WRITE_UC();
			if (T != HC_TBASE) {
				REPLACE_UC_WITH(T);
				WRITE_UC();
			}
			continue;
		}
		if (IS_DECOMPOSABLE_BLOCK(uc) && CCC(uc) != 0) {
			WRITE_UC();
			continue;
		}

		fdi = 0;
		while (get_nfd(&cp1, &cp2, uc) && fdi < FDC_MAX) {
			int k;

			for (k = fdi; k > 0; k--)
				fdc[k] = fdc[k-1];
			fdc[0].ccc = CCC(cp2);
			fdc[0].uc = cp2;
			fdi++;
			REPLACE_UC_WITH(cp1);
		}

		/* Read following code points. */
		while ((n2 = parse(&uc2, s, len)) > 0 &&
		    (ccc = CCC(uc2)) != 0 && fdi < FDC_MAX) {
			int j, k;

			s += n2;
			len -= n2;
			for (j = 0; j < fdi; j++) {
				if (fdc[j].ccc > ccc)
					break;
			}
			if (j < fdi) {
				for (k = fdi; k > j; k--)
					fdc[k] = fdc[k-1];
				fdc[j].ccc = ccc;
				fdc[j].uc = uc2;
			} else {
				fdc[fdi].ccc = ccc;
				fdc[fdi].uc = uc2;
			}
			fdi++;
		}

		WRITE_UC();
		for (fdj = 0; fdj < fdi; fdj++) {
			REPLACE_UC_WITH(fdc[fdj].uc);
			WRITE_UC();
		}

		if (n2 == 0)
			break;
		REPLACE_UC_WITH(uc2);
		n = n2;
		goto check_first_code;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}